

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  BYTE *pBVar7;
  undefined8 *puVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  BYTE *pBVar13;
  bool bVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  BYTE *pStart;
  ulong *puVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  int iVar22;
  ulong *puVar23;
  ulong *puVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  int iVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong *puVar32;
  uint uVar33;
  U32 UVar34;
  uint uVar35;
  int *piVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  BYTE *litEnd;
  ulong *puVar43;
  long lVar44;
  BYTE *litEnd_2;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  BYTE *litLimit_w_9;
  uint local_12c;
  ulong *local_128;
  ulong *local_120;
  ulong local_118;
  BYTE *local_108;
  ulong *local_e8;
  BYTE *local_d0;
  ulong local_c8;
  int local_b8;
  ulong *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ulong local_80;
  ulong local_70;
  
  pBVar9 = (ms->window).base;
  puVar6 = (ulong *)((long)src + srcSize);
  iVar42 = (int)pBVar9;
  iVar29 = (int)puVar6 - iVar42;
  uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar37 = (ms->window).dictLimit;
  uVar25 = iVar29 - uVar41;
  if (iVar29 - uVar37 <= uVar41) {
    uVar25 = uVar37;
  }
  lVar44 = 0;
  if (ms->loadedDictEnd != 0) {
    uVar25 = uVar37;
  }
  puVar30 = (ulong *)(pBVar9 + uVar25);
  puVar43 = (ulong *)((long)src + (ulong)(puVar30 == (ulong *)src));
  iVar29 = (int)puVar43 - iVar42;
  uVar33 = iVar29 - uVar41;
  if (iVar29 - uVar37 <= uVar41) {
    uVar33 = uVar37;
  }
  if (ms->loadedDictEnd != 0) {
    uVar33 = uVar37;
  }
  uVar37 = rep[1];
  uVar33 = iVar29 - uVar33;
  uVar31 = (ulong)uVar37;
  if (uVar33 < uVar37) {
    uVar31 = 0;
  }
  puVar18 = (ulong *)((long)src + (srcSize - 8));
  uVar41 = *rep;
  local_12c = 0;
  if (uVar41 <= uVar33) {
    local_12c = uVar41;
  }
  local_128 = (ulong *)((long)src + (ulong)(puVar30 == (ulong *)src) + 1);
  uVar16 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  pUVar11 = ms->chainTable;
  if (uVar16 == 5) {
    if (local_128 <= puVar18) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 - 7);
      puVar2 = (ulong *)((long)puVar6 - 3);
      puVar3 = (ulong *)((long)puVar6 - 1);
      puVar4 = puVar6 + -4;
      uVar26 = (ulong)local_12c;
      pBVar5 = pBVar9 + -1;
      local_e8 = (ulong *)pBVar5;
      local_d0 = pBVar5;
LAB_01da6816:
      uVar16 = (uint)uVar31;
      local_70 = *puVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      local_98 = puVar43 + 0x20;
      local_90 = (BYTE *)(ulong)pUVar10[local_70];
      puVar32 = (ulong *)(local_90 + (long)pBVar9);
      local_12c = (uint)uVar26;
      lVar19 = -uVar26;
      local_108 = (BYTE *)0x1;
      do {
        uVar31 = *puVar43;
        uVar26 = uVar31 * -0x30e4432345000000 >> (bVar21 & 0x3f);
        uVar35 = pUVar11[uVar26];
        UVar34 = (int)puVar43 - iVar42;
        piVar36 = (int *)(pBVar9 + uVar35);
        pUVar11[uVar26] = UVar34;
        pUVar10[local_70] = UVar34;
        puVar28 = local_128;
        if ((local_12c == 0) ||
           (*(int *)((long)puVar43 + lVar19 + 1) != *(int *)((long)puVar43 + 1))) {
          local_88 = (BYTE *)(*local_128 * -0x30e44323485a9b9d >> (bVar20 & 0x3f));
          if ((uVar25 < (uint)local_90) && (*puVar32 == uVar31)) {
            puVar27 = puVar43 + 1;
            puVar24 = puVar32 + 1;
            puVar23 = puVar27;
            if (puVar27 < puVar1) {
              uVar26 = *puVar27 ^ *puVar24;
              uVar31 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = uVar31 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar27) {
                puVar23 = puVar43 + 2;
                puVar24 = puVar32 + 2;
                do {
                  if (puVar1 <= puVar23) goto LAB_01da6c45;
                  uVar26 = *puVar24;
                  uVar38 = *puVar23;
                  uVar39 = uVar38 ^ uVar26;
                  uVar31 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (long)puVar23 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27);
                  puVar23 = puVar23 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar26 == uVar38);
              }
            }
            else {
LAB_01da6c45:
              if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar23 < puVar6) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
              }
              uVar31 = (long)puVar23 - (long)puVar27;
            }
            lVar44 = uVar31 + 8;
            local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)puVar32);
            iVar29 = 0xc;
            if ((puVar30 < puVar32) && (src < puVar43)) {
              while( true ) {
                puVar24 = (ulong *)((long)puVar32 + -1);
                puVar27 = (ulong *)((long)puVar43 + -1);
                if (*(char *)puVar27 != *(char *)puVar24) break;
                lVar44 = lVar44 + 1;
                puVar32 = puVar24;
                puVar43 = puVar27;
                if ((puVar27 <= src) || (puVar24 <= puVar30)) break;
              }
            }
          }
          else {
            local_e8 = (ulong *)(ulong)pUVar10[(long)local_88];
            local_120 = (ulong *)((long)local_e8 + (long)pBVar9);
            if ((uVar35 <= uVar25) || (iVar29 = 0xd, *piVar36 != (int)*puVar43)) {
              if (local_98 <= local_128) {
                local_108 = (BYTE *)((long)local_108 + 1);
                local_98 = local_98 + 0x20;
              }
              iVar29 = 0;
              puVar28 = (ulong *)((long)local_128 + (long)local_108);
              puVar32 = local_120;
              puVar43 = local_128;
              local_90 = (BYTE *)local_e8;
              local_70 = (ulong)local_88;
            }
          }
        }
        else {
          puVar24 = (ulong *)((long)puVar43 + 5);
          puVar23 = (ulong *)((long)puVar43 + lVar19 + 5);
          puVar27 = puVar24;
          if (puVar24 < puVar1) {
            uVar26 = *puVar24 ^ *puVar23;
            uVar31 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = uVar31 >> 3 & 0x1fffffff;
            if (*puVar23 == *puVar24) {
              puVar27 = (ulong *)((long)puVar43 + 0xd);
              puVar23 = (ulong *)((long)puVar43 + lVar19 + 0xd);
              do {
                if (puVar1 <= puVar27) goto LAB_01da6a7f;
                uVar26 = *puVar23;
                uVar38 = *puVar27;
                uVar39 = uVar38 ^ uVar26;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = (long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar24);
                puVar27 = puVar27 + 1;
                puVar23 = puVar23 + 1;
              } while (uVar26 == uVar38);
            }
          }
          else {
LAB_01da6a7f:
            if ((puVar27 < puVar2) && ((int)*puVar23 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar27 < puVar3) && ((short)*puVar23 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar27 < puVar6) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
            }
            uVar31 = (long)puVar27 - (long)puVar24;
          }
          puVar43 = (ulong *)((long)puVar43 + 1);
          uVar26 = (long)puVar43 - (long)src;
          puVar24 = (ulong *)seqStore->lit;
          if (puVar4 < puVar43) {
            ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
          }
          else {
            uVar38 = *(ulong *)((long)src + 8);
            *puVar24 = *src;
            puVar24[1] = uVar38;
            if (0x10 < uVar26) {
              pBVar13 = seqStore->lit;
              uVar38 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar13 + 0x18) = uVar38;
              if (0x20 < (long)uVar26) {
                lVar44 = 0;
                do {
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x20);
                  uVar15 = puVar8[1];
                  pBVar7 = pBVar13 + lVar44 + 0x20;
                  *(undefined8 *)pBVar7 = *puVar8;
                  *(undefined8 *)(pBVar7 + 8) = uVar15;
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x30);
                  uVar15 = puVar8[1];
                  *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar7 + 0x18) = uVar15;
                  lVar44 = lVar44 + 0x20;
                } while (pBVar7 + 0x20 < pBVar13 + uVar26);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar26;
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar26;
          psVar12->offBase = 1;
          if (0xffff < uVar31 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar44 = uVar31 + 4;
          psVar12->mlBase = (U16)(uVar31 + 1);
          seqStore->sequences = psVar12 + 1;
          iVar29 = 9;
        }
        if (iVar29 != 0) goto LAB_01da6cfd;
        local_128 = puVar28;
        if (puVar18 < puVar28) goto LAB_01da8af0;
      } while( true );
    }
  }
  else if (uVar16 == 6) {
    uVar26 = (ulong)local_12c;
    if (local_128 <= puVar18) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 - 7);
      puVar2 = (ulong *)((long)puVar6 - 3);
      puVar3 = (ulong *)((long)puVar6 - 1);
      puVar4 = puVar6 + -4;
      pBVar5 = pBVar9 + -1;
      local_e8 = (ulong *)pBVar5;
      local_d0 = pBVar5;
LAB_01da73e8:
      uVar16 = (uint)uVar31;
      local_70 = *puVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      local_98 = puVar43 + 0x20;
      local_90 = (BYTE *)(ulong)pUVar10[local_70];
      puVar32 = (ulong *)(local_90 + (long)pBVar9);
      local_12c = (uint)uVar26;
      lVar19 = -uVar26;
      local_108 = (BYTE *)0x1;
      do {
        uVar31 = *puVar43;
        uVar26 = uVar31 * -0x30e4432340650000 >> (bVar21 & 0x3f);
        uVar35 = pUVar11[uVar26];
        UVar34 = (int)puVar43 - iVar42;
        piVar36 = (int *)(pBVar9 + uVar35);
        pUVar11[uVar26] = UVar34;
        pUVar10[local_70] = UVar34;
        puVar28 = local_128;
        if ((local_12c == 0) ||
           (*(int *)((long)puVar43 + lVar19 + 1) != *(int *)((long)puVar43 + 1))) {
          local_88 = (BYTE *)(*local_128 * -0x30e44323485a9b9d >> (bVar20 & 0x3f));
          if ((uVar25 < (uint)local_90) && (*puVar32 == uVar31)) {
            puVar27 = puVar43 + 1;
            puVar24 = puVar32 + 1;
            puVar23 = puVar27;
            if (puVar27 < puVar1) {
              uVar26 = *puVar27 ^ *puVar24;
              uVar31 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = uVar31 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar27) {
                puVar23 = puVar43 + 2;
                puVar24 = puVar32 + 2;
                do {
                  if (puVar1 <= puVar23) goto LAB_01da7817;
                  uVar26 = *puVar24;
                  uVar38 = *puVar23;
                  uVar39 = uVar38 ^ uVar26;
                  uVar31 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (long)puVar23 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27);
                  puVar23 = puVar23 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar26 == uVar38);
              }
            }
            else {
LAB_01da7817:
              if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar23 < puVar6) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
              }
              uVar31 = (long)puVar23 - (long)puVar27;
            }
            lVar44 = uVar31 + 8;
            local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)puVar32);
            iVar29 = 0xc;
            if ((puVar30 < puVar32) && (src < puVar43)) {
              while( true ) {
                puVar24 = (ulong *)((long)puVar32 + -1);
                puVar27 = (ulong *)((long)puVar43 + -1);
                if (*(char *)puVar27 != *(char *)puVar24) break;
                lVar44 = lVar44 + 1;
                puVar32 = puVar24;
                puVar43 = puVar27;
                if ((puVar27 <= src) || (puVar24 <= puVar30)) break;
              }
            }
          }
          else {
            local_e8 = (ulong *)(ulong)pUVar10[(long)local_88];
            local_120 = (ulong *)((long)local_e8 + (long)pBVar9);
            if ((uVar35 <= uVar25) || (iVar29 = 0xd, *piVar36 != (int)*puVar43)) {
              if (local_98 <= local_128) {
                local_108 = (BYTE *)((long)local_108 + 1);
                local_98 = local_98 + 0x20;
              }
              iVar29 = 0;
              puVar28 = (ulong *)((long)local_128 + (long)local_108);
              puVar32 = local_120;
              puVar43 = local_128;
              local_90 = (BYTE *)local_e8;
              local_70 = (ulong)local_88;
            }
          }
        }
        else {
          puVar24 = (ulong *)((long)puVar43 + 5);
          puVar23 = (ulong *)((long)puVar43 + lVar19 + 5);
          puVar27 = puVar24;
          if (puVar24 < puVar1) {
            uVar26 = *puVar24 ^ *puVar23;
            uVar31 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = uVar31 >> 3 & 0x1fffffff;
            if (*puVar23 == *puVar24) {
              puVar27 = (ulong *)((long)puVar43 + 0xd);
              puVar23 = (ulong *)((long)puVar43 + lVar19 + 0xd);
              do {
                if (puVar1 <= puVar27) goto LAB_01da7651;
                uVar26 = *puVar23;
                uVar38 = *puVar27;
                uVar39 = uVar38 ^ uVar26;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = (long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar24);
                puVar27 = puVar27 + 1;
                puVar23 = puVar23 + 1;
              } while (uVar26 == uVar38);
            }
          }
          else {
LAB_01da7651:
            if ((puVar27 < puVar2) && ((int)*puVar23 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar27 < puVar3) && ((short)*puVar23 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar27 < puVar6) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
            }
            uVar31 = (long)puVar27 - (long)puVar24;
          }
          puVar43 = (ulong *)((long)puVar43 + 1);
          uVar26 = (long)puVar43 - (long)src;
          puVar24 = (ulong *)seqStore->lit;
          if (puVar4 < puVar43) {
            ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
          }
          else {
            uVar38 = *(ulong *)((long)src + 8);
            *puVar24 = *src;
            puVar24[1] = uVar38;
            if (0x10 < uVar26) {
              pBVar13 = seqStore->lit;
              uVar38 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar13 + 0x18) = uVar38;
              if (0x20 < (long)uVar26) {
                lVar44 = 0;
                do {
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x20);
                  uVar15 = puVar8[1];
                  pBVar7 = pBVar13 + lVar44 + 0x20;
                  *(undefined8 *)pBVar7 = *puVar8;
                  *(undefined8 *)(pBVar7 + 8) = uVar15;
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x30);
                  uVar15 = puVar8[1];
                  *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar7 + 0x18) = uVar15;
                  lVar44 = lVar44 + 0x20;
                } while (pBVar7 + 0x20 < pBVar13 + uVar26);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar26;
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar26;
          psVar12->offBase = 1;
          if (0xffff < uVar31 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar44 = uVar31 + 4;
          psVar12->mlBase = (U16)(uVar31 + 1);
          seqStore->sequences = psVar12 + 1;
          iVar29 = 9;
        }
        if (iVar29 != 0) goto LAB_01da78cf;
        local_128 = puVar28;
        if (puVar18 < puVar28) goto LAB_01da8af0;
      } while( true );
    }
  }
  else if (uVar16 == 7) {
    if (local_128 <= puVar18) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar6 - 7);
      puVar2 = (ulong *)((long)puVar6 - 3);
      puVar3 = (ulong *)((long)puVar6 - 1);
      puVar4 = puVar6 + -4;
      pBVar5 = pBVar9 + -1;
      local_e8 = (ulong *)pBVar5;
      local_d0 = pBVar5;
LAB_01da5c18:
      uVar16 = (uint)uVar31;
      local_80 = *puVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      local_98 = puVar43 + 0x20;
      local_90 = (BYTE *)(ulong)pUVar10[local_80];
      puVar32 = (ulong *)(local_90 + (long)pBVar9);
      lVar19 = -(ulong)local_12c;
      local_108 = (BYTE *)0x1;
      do {
        uVar31 = *puVar43;
        uVar26 = uVar31 * -0x30e44323405a9d00 >> (bVar21 & 0x3f);
        uVar35 = pUVar11[uVar26];
        UVar34 = (int)puVar43 - iVar42;
        piVar36 = (int *)(pBVar9 + uVar35);
        pUVar11[uVar26] = UVar34;
        pUVar10[local_80] = UVar34;
        puVar28 = local_128;
        if ((local_12c == 0) ||
           (*(int *)((long)puVar43 + lVar19 + 1) != *(int *)((long)puVar43 + 1))) {
          local_88 = (BYTE *)(*local_128 * -0x30e44323485a9b9d >> (bVar20 & 0x3f));
          if ((uVar25 < (uint)local_90) && (*puVar32 == uVar31)) {
            puVar27 = puVar43 + 1;
            puVar24 = puVar32 + 1;
            puVar23 = puVar27;
            if (puVar27 < puVar1) {
              uVar26 = *puVar27 ^ *puVar24;
              uVar31 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = uVar31 >> 3 & 0x1fffffff;
              if (*puVar24 == *puVar27) {
                puVar23 = puVar43 + 2;
                puVar24 = puVar32 + 2;
                do {
                  if (puVar1 <= puVar23) goto LAB_01da6060;
                  uVar26 = *puVar24;
                  uVar38 = *puVar23;
                  uVar39 = uVar38 ^ uVar26;
                  uVar31 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (long)puVar23 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27);
                  puVar23 = puVar23 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar26 == uVar38);
              }
            }
            else {
LAB_01da6060:
              if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar23 < puVar6) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
              }
              uVar31 = (long)puVar23 - (long)puVar27;
            }
            lVar44 = uVar31 + 8;
            local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)puVar32);
            iVar29 = 0xc;
            if ((puVar30 < puVar32) && (src < puVar43)) {
              while( true ) {
                puVar24 = (ulong *)((long)puVar32 + -1);
                puVar27 = (ulong *)((long)puVar43 + -1);
                if (*(char *)puVar27 != *(char *)puVar24) break;
                lVar44 = lVar44 + 1;
                puVar32 = puVar24;
                puVar43 = puVar27;
                if ((puVar27 <= src) || (puVar24 <= puVar30)) break;
              }
            }
          }
          else {
            local_e8 = (ulong *)(ulong)pUVar10[(long)local_88];
            local_120 = (ulong *)((long)local_e8 + (long)pBVar9);
            if ((uVar35 <= uVar25) || (iVar29 = 0xd, *piVar36 != (int)*puVar43)) {
              if (local_98 <= local_128) {
                local_108 = (BYTE *)((long)local_108 + 1);
                local_98 = local_98 + 0x20;
              }
              iVar29 = 0;
              puVar28 = (ulong *)((long)local_128 + (long)local_108);
              puVar32 = local_120;
              puVar43 = local_128;
              local_90 = (BYTE *)local_e8;
              local_80 = (ulong)local_88;
            }
          }
        }
        else {
          puVar24 = (ulong *)((long)puVar43 + 5);
          puVar23 = (ulong *)((long)puVar43 + lVar19 + 5);
          puVar27 = puVar24;
          if (puVar24 < puVar1) {
            uVar26 = *puVar24 ^ *puVar23;
            uVar31 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = uVar31 >> 3 & 0x1fffffff;
            if (*puVar23 == *puVar24) {
              puVar27 = (ulong *)((long)puVar43 + 0xd);
              puVar23 = (ulong *)((long)puVar43 + lVar19 + 0xd);
              do {
                if (puVar1 <= puVar27) goto LAB_01da5e9f;
                uVar26 = *puVar23;
                uVar38 = *puVar27;
                uVar39 = uVar38 ^ uVar26;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = (long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar24);
                puVar27 = puVar27 + 1;
                puVar23 = puVar23 + 1;
              } while (uVar26 == uVar38);
            }
          }
          else {
LAB_01da5e9f:
            if ((puVar27 < puVar2) && ((int)*puVar23 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar27 < puVar3) && ((short)*puVar23 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar27 < puVar6) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
            }
            uVar31 = (long)puVar27 - (long)puVar24;
          }
          puVar43 = (ulong *)((long)puVar43 + 1);
          uVar26 = (long)puVar43 - (long)src;
          puVar24 = (ulong *)seqStore->lit;
          if (puVar4 < puVar43) {
            ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
          }
          else {
            uVar38 = *(ulong *)((long)src + 8);
            *puVar24 = *src;
            puVar24[1] = uVar38;
            if (0x10 < uVar26) {
              pBVar13 = seqStore->lit;
              uVar38 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar13 + 0x18) = uVar38;
              if (0x20 < (long)uVar26) {
                lVar44 = 0;
                do {
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x20);
                  uVar15 = puVar8[1];
                  pBVar7 = pBVar13 + lVar44 + 0x20;
                  *(undefined8 *)pBVar7 = *puVar8;
                  *(undefined8 *)(pBVar7 + 8) = uVar15;
                  puVar8 = (undefined8 *)((long)src + lVar44 + 0x30);
                  uVar15 = puVar8[1];
                  *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar7 + 0x18) = uVar15;
                  lVar44 = lVar44 + 0x20;
                } while (pBVar7 + 0x20 < pBVar13 + uVar26);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar26;
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar26;
          psVar12->offBase = 1;
          if (0xffff < uVar31 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar44 = uVar31 + 4;
          psVar12->mlBase = (U16)(uVar31 + 1);
          seqStore->sequences = psVar12 + 1;
          iVar29 = 9;
        }
        if (iVar29 != 0) goto LAB_01da6118;
        local_128 = puVar28;
        if (puVar18 < puVar28) goto LAB_01da8af0;
      } while( true );
    }
  }
  else if (local_128 <= puVar18) {
    bVar20 = 0x40 - (char)(ms->cParams).hashLog;
    bVar21 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar6 - 7);
    puVar2 = (ulong *)((long)puVar6 - 3);
    puVar3 = (ulong *)((long)puVar6 - 1);
    puVar4 = puVar6 + -4;
    pBVar5 = pBVar9 + -1;
    local_108 = pBVar5;
    local_98 = (ulong *)pBVar5;
LAB_01da7fa5:
    uVar16 = (uint)uVar31;
    local_70 = *puVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
    local_120 = puVar43 + 0x20;
    local_88 = (BYTE *)(ulong)pUVar10[local_70];
    puVar32 = (ulong *)(local_88 + (long)pBVar9);
    lVar19 = -(ulong)local_12c;
    local_118 = 1;
    do {
      uVar17 = (uint)((int)*puVar43 * -0x61c8864f) >> (bVar21 & 0x1f);
      uVar35 = pUVar11[uVar17];
      UVar34 = (int)puVar43 - iVar42;
      piVar36 = (int *)(pBVar9 + uVar35);
      pUVar11[uVar17] = UVar34;
      pUVar10[local_70] = UVar34;
      puVar28 = local_128;
      if ((local_12c == 0) || (*(int *)((long)puVar43 + lVar19 + 1) != *(int *)((long)puVar43 + 1)))
      {
        local_c8 = *local_128 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        if ((uVar25 < (uint)local_88) && (*puVar32 == *puVar43)) {
          puVar27 = puVar43 + 1;
          puVar24 = puVar32 + 1;
          puVar23 = puVar27;
          if (puVar27 < puVar1) {
            uVar26 = *puVar27 ^ *puVar24;
            uVar31 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = uVar31 >> 3 & 0x1fffffff;
            if (*puVar24 == *puVar27) {
              puVar23 = puVar43 + 2;
              puVar24 = puVar32 + 2;
              do {
                if (puVar1 <= puVar23) goto LAB_01da83d0;
                uVar26 = *puVar24;
                uVar38 = *puVar23;
                uVar39 = uVar38 ^ uVar26;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = (long)puVar23 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar27);
                puVar23 = puVar23 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar26 == uVar38);
            }
          }
          else {
LAB_01da83d0:
            if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar23 < puVar6) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar24 == (char)*puVar23));
            }
            uVar31 = (long)puVar23 - (long)puVar27;
          }
          lVar44 = uVar31 + 8;
          local_98 = (ulong *)(ulong)(uint)((int)puVar43 - (int)puVar32);
          iVar29 = 0xc;
          if ((puVar30 < puVar32) && (src < puVar43)) {
            while( true ) {
              puVar24 = (ulong *)((long)puVar32 + -1);
              puVar27 = (ulong *)((long)puVar43 + -1);
              if (*(char *)puVar27 != *(char *)puVar24) break;
              lVar44 = lVar44 + 1;
              puVar32 = puVar24;
              puVar43 = puVar27;
              if ((puVar27 <= src) || (puVar24 <= puVar30)) break;
            }
          }
        }
        else {
          local_108 = (BYTE *)(ulong)pUVar10[local_c8];
          local_e8 = (ulong *)(local_108 + (long)pBVar9);
          if ((uVar35 <= uVar25) || (iVar29 = 0xd, *piVar36 != (int)*puVar43)) {
            if (local_120 <= local_128) {
              local_118 = local_118 + 1;
              local_120 = local_120 + 0x20;
            }
            iVar29 = 0;
            puVar28 = (ulong *)((long)local_128 + local_118);
            puVar32 = local_e8;
            puVar43 = local_128;
            local_88 = local_108;
            local_70 = local_c8;
          }
        }
      }
      else {
        puVar24 = (ulong *)((long)puVar43 + 5);
        puVar23 = (ulong *)((long)puVar43 + lVar19 + 5);
        puVar27 = puVar24;
        if (puVar24 < puVar1) {
          uVar26 = *puVar24 ^ *puVar23;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar23 == *puVar24) {
            puVar27 = (ulong *)((long)puVar43 + 0xd);
            puVar23 = (ulong *)((long)puVar43 + lVar19 + 0xd);
            do {
              if (puVar1 <= puVar27) goto LAB_01da8217;
              uVar26 = *puVar23;
              uVar38 = *puVar27;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar27 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar24);
              puVar27 = puVar27 + 1;
              puVar23 = puVar23 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da8217:
          if ((puVar27 < puVar2) && ((int)*puVar23 == (int)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 4);
            puVar23 = (ulong *)((long)puVar23 + 4);
          }
          if ((puVar27 < puVar3) && ((short)*puVar23 == (short)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 2);
            puVar23 = (ulong *)((long)puVar23 + 2);
          }
          if (puVar27 < puVar6) {
            puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
          }
          uVar31 = (long)puVar27 - (long)puVar24;
        }
        puVar43 = (ulong *)((long)puVar43 + 1);
        uVar26 = (long)puVar43 - (long)src;
        puVar24 = (ulong *)seqStore->lit;
        if (puVar4 < puVar43) {
          ZSTD_safecopyLiterals((BYTE *)puVar24,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
        }
        else {
          uVar38 = *(ulong *)((long)src + 8);
          *puVar24 = *src;
          puVar24[1] = uVar38;
          if (0x10 < uVar26) {
            pBVar13 = seqStore->lit;
            uVar38 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar13 + 0x18) = uVar38;
            if (0x20 < (long)uVar26) {
              lVar44 = 0;
              do {
                puVar8 = (undefined8 *)((long)src + lVar44 + 0x20);
                uVar15 = puVar8[1];
                pBVar7 = pBVar13 + lVar44 + 0x20;
                *(undefined8 *)pBVar7 = *puVar8;
                *(undefined8 *)(pBVar7 + 8) = uVar15;
                puVar8 = (undefined8 *)((long)src + lVar44 + 0x30);
                uVar15 = puVar8[1];
                *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
                *(undefined8 *)(pBVar7 + 0x18) = uVar15;
                lVar44 = lVar44 + 0x20;
              } while (pBVar7 + 0x20 < pBVar13 + uVar26);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar26;
        if (0xffff < uVar26) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar26;
        psVar12->offBase = 1;
        if (0xffff < uVar31 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar44 = uVar31 + 4;
        psVar12->mlBase = (U16)(uVar31 + 1);
        seqStore->sequences = psVar12 + 1;
        iVar29 = 9;
      }
      if (iVar29 != 0) goto LAB_01da848e;
      local_128 = puVar28;
      if (puVar18 < puVar28) goto LAB_01da8af0;
    } while( true );
  }
  uVar16 = (uint)uVar31;
LAB_01da8af0:
  if (uVar37 <= uVar33) {
    uVar37 = 0;
  }
  uVar25 = uVar37;
  if (local_12c != 0) {
    uVar25 = uVar41;
  }
  if (uVar41 <= uVar33) {
    uVar25 = uVar37;
    uVar41 = 0;
  }
  if (local_12c != 0) {
    uVar41 = local_12c;
  }
  if (uVar16 != 0) {
    uVar25 = uVar16;
  }
  *rep = uVar41;
  rep[1] = uVar25;
  return (long)puVar6 - (long)src;
LAB_01da6cfd:
  if (iVar29 != 9) {
    iVar22 = (int)puVar28;
    if (iVar29 != 0xc) {
      if ((uVar25 < (uint)local_e8) && (*local_120 == *puVar28)) {
        puVar43 = puVar28 + 1;
        puVar32 = local_120 + 1;
        puVar24 = puVar43;
        if (puVar43 < puVar1) {
          uVar26 = *puVar43 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar43) {
            puVar24 = puVar28 + 2;
            puVar32 = local_120 + 2;
            do {
              if (puVar1 <= puVar24) goto LAB_01da6f0d;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar43);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da6f0d:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar43;
        }
        lVar44 = uVar31 + 8;
        local_d0 = (BYTE *)(ulong)(uint)(iVar22 - (int)local_120);
        puVar43 = puVar28;
        if ((puVar30 < local_120) && (src < puVar28)) {
          while( true ) {
            puVar24 = (ulong *)((long)puVar28 + -1);
            puVar32 = (ulong *)((long)local_120 + -1);
            puVar43 = puVar28;
            if (*(char *)puVar24 != *(char *)puVar32) break;
            lVar44 = lVar44 + 1;
            puVar43 = puVar24;
            local_120 = puVar32;
            if ((puVar24 <= src) || (puVar28 = puVar24, puVar32 <= puVar30)) break;
          }
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar43 + 4);
        puVar32 = (ulong *)(piVar36 + 1);
        puVar24 = puVar28;
        if (puVar28 < puVar1) {
          uVar26 = *puVar28 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar28) {
            puVar24 = (ulong *)((long)puVar43 + 0xc);
            puVar32 = (ulong *)(piVar36 + 3);
            do {
              if (puVar1 <= puVar24) goto LAB_01da6e47;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da6e47:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar28;
        }
        lVar44 = uVar31 + 4;
        local_c8._0_4_ = (int)piVar36;
        local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)local_c8);
        if ((uVar25 < uVar35) && (src < puVar43)) {
          puVar32 = (ulong *)(pBVar5 + uVar35);
          do {
            puVar28 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar28 != (char)*puVar32) ||
               (lVar44 = lVar44 + 1, puVar43 = puVar28, puVar28 <= src)) break;
            bVar14 = puVar30 < puVar32;
            puVar32 = (ulong *)((long)puVar32 + -1);
          } while (bVar14);
        }
      }
    }
    if (local_108 < 4) {
      pUVar10[(long)local_88] = iVar22 - iVar42;
    }
    uVar31 = (long)puVar43 - (long)src;
    puVar32 = (ulong *)seqStore->lit;
    if (puVar4 < puVar43) {
      ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
    }
    else {
      uVar26 = *(ulong *)((long)src + 8);
      *puVar32 = *src;
      puVar32[1] = uVar26;
      if (0x10 < uVar31) {
        pBVar13 = seqStore->lit;
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar13 + 0x18) = uVar26;
        if (0x20 < (long)uVar31) {
          lVar19 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar15 = puVar8[1];
            pBVar7 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar7 = *puVar8;
            *(undefined8 *)(pBVar7 + 8) = uVar15;
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar15 = puVar8[1];
            *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar7 + 0x18) = uVar15;
            lVar19 = lVar19 + 0x20;
          } while (pBVar7 + 0x20 < pBVar13 + uVar31);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar31;
    if (0xffff < uVar31) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12 = seqStore->sequences;
    psVar12->litLength = (U16)uVar31;
    psVar12->offBase = (uint)local_d0 + 3;
    if (0xffff < lVar44 - 3U) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(lVar44 - 3U);
    seqStore->sequences = psVar12 + 1;
    uVar16 = local_12c;
    local_12c = (uint)local_d0;
  }
  puVar43 = (ulong *)((long)puVar43 + lVar44);
  if (puVar18 < puVar43) {
    uVar31 = (ulong)uVar16;
    uVar26 = (ulong)local_12c;
  }
  else {
    uVar35 = UVar34 + 2;
    lVar19 = *(long *)(pBVar9 + uVar35);
    pUVar10[(ulong)(lVar19 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar35;
    pUVar10[(ulong)(*(long *)((long)puVar43 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar43 + -2) - iVar42;
    pUVar11[(ulong)(lVar19 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar35;
    pUVar11[(ulong)(*(long *)((long)puVar43 + -1) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)puVar43 + -1) - iVar42;
    do {
      uVar35 = uVar16;
      uVar38 = (ulong)uVar35;
      uVar31 = uVar38;
      uVar26 = (ulong)local_12c;
      if ((uVar35 == 0) || ((int)*puVar43 != *(int *)((long)puVar43 - uVar38))) break;
      puVar32 = (ulong *)((long)puVar43 + 4);
      puVar24 = (ulong *)((long)puVar43 + (4 - uVar38));
      puVar28 = puVar32;
      if (puVar32 < puVar1) {
        uVar26 = *puVar32 ^ *puVar24;
        uVar31 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar31 = uVar31 >> 3 & 0x1fffffff;
        if (*puVar24 == *puVar32) {
          puVar28 = (ulong *)((long)puVar43 + 0xc);
          puVar24 = (ulong *)((long)puVar43 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar28) goto LAB_01da7214;
            uVar26 = *puVar24;
            uVar39 = *puVar28;
            uVar40 = uVar39 ^ uVar26;
            uVar31 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = (long)puVar28 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar32);
            puVar28 = puVar28 + 1;
            puVar24 = puVar24 + 1;
          } while (uVar26 == uVar39);
        }
      }
      else {
LAB_01da7214:
        if ((puVar28 < puVar2) && ((int)*puVar24 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar28 < puVar3) && ((short)*puVar24 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar28 < puVar6) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar24 == (char)*puVar28));
        }
        uVar31 = (long)puVar28 - (long)puVar32;
      }
      UVar34 = (int)puVar43 - iVar42;
      uVar26 = *puVar43;
      pUVar11[uVar26 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar34;
      pUVar10[uVar26 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar34;
      puVar32 = (ulong *)seqStore->lit;
      if (puVar4 < puVar43) {
        ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)puVar43,(BYTE *)puVar43,(BYTE *)puVar4);
      }
      else {
        uVar26 = puVar43[1];
        *puVar32 = *puVar43;
        puVar32[1] = uVar26;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < uVar31 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(uVar31 + 1);
      seqStore->sequences = psVar12 + 1;
      puVar43 = (ulong *)((long)puVar43 + uVar31 + 4);
      uVar31 = (ulong)local_12c;
      uVar26 = uVar38;
      uVar16 = local_12c;
      local_12c = uVar35;
    } while (puVar43 <= puVar18);
  }
  local_128 = (ulong *)((long)puVar43 + 1);
  local_12c = (uint)uVar26;
  uVar16 = (uint)uVar31;
  src = puVar43;
  if (puVar18 < local_128) goto LAB_01da8af0;
  goto LAB_01da6816;
LAB_01da848e:
  uVar17 = local_12c;
  if (iVar29 != 9) {
    iVar22 = (int)puVar28;
    if (iVar29 != 0xc) {
      if ((uVar25 < (uint)local_108) && (*local_e8 == *puVar28)) {
        puVar43 = puVar28 + 1;
        puVar32 = local_e8 + 1;
        puVar24 = puVar43;
        if (puVar43 < puVar1) {
          uVar26 = *puVar43 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar43) {
            puVar24 = puVar28 + 2;
            puVar32 = local_e8 + 2;
            do {
              if (puVar1 <= puVar24) goto LAB_01da86a6;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar43);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da86a6:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar43;
        }
        lVar44 = uVar31 + 8;
        local_98 = (ulong *)(ulong)(uint)(iVar22 - (int)local_e8);
        puVar43 = puVar28;
        if ((puVar30 < local_e8) && (src < puVar28)) {
          while( true ) {
            puVar24 = (ulong *)((long)puVar28 + -1);
            puVar32 = (ulong *)((long)local_e8 + -1);
            puVar43 = puVar28;
            if (*(char *)puVar24 != *(char *)puVar32) break;
            lVar44 = lVar44 + 1;
            puVar43 = puVar24;
            local_e8 = puVar32;
            if ((puVar24 <= src) || (puVar28 = puVar24, puVar32 <= puVar30)) break;
          }
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar43 + 4);
        puVar32 = (ulong *)(piVar36 + 1);
        puVar24 = puVar28;
        if (puVar28 < puVar1) {
          uVar26 = *puVar28 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar28) {
            puVar24 = (ulong *)((long)puVar43 + 0xc);
            puVar32 = (ulong *)(piVar36 + 3);
            do {
              if (puVar1 <= puVar24) goto LAB_01da85d7;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da85d7:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar28;
        }
        lVar44 = uVar31 + 4;
        local_b8 = (int)piVar36;
        local_98 = (ulong *)(ulong)(uint)((int)puVar43 - local_b8);
        if ((uVar25 < uVar35) && (src < puVar43)) {
          puVar32 = (ulong *)(pBVar5 + uVar35);
          do {
            puVar28 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar28 != (char)*puVar32) ||
               (lVar44 = lVar44 + 1, puVar43 = puVar28, puVar28 <= src)) break;
            bVar14 = puVar30 < puVar32;
            puVar32 = (ulong *)((long)puVar32 + -1);
          } while (bVar14);
        }
      }
    }
    if (local_118 < 4) {
      pUVar10[local_c8] = iVar22 - iVar42;
    }
    uVar31 = (long)puVar43 - (long)src;
    puVar32 = (ulong *)seqStore->lit;
    if (puVar4 < puVar43) {
      ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
    }
    else {
      uVar26 = *(ulong *)((long)src + 8);
      *puVar32 = *src;
      puVar32[1] = uVar26;
      if (0x10 < uVar31) {
        pBVar13 = seqStore->lit;
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar13 + 0x18) = uVar26;
        if (0x20 < (long)uVar31) {
          lVar19 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar15 = puVar8[1];
            pBVar7 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar7 = *puVar8;
            *(undefined8 *)(pBVar7 + 8) = uVar15;
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar15 = puVar8[1];
            *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar7 + 0x18) = uVar15;
            lVar19 = lVar19 + 0x20;
          } while (pBVar7 + 0x20 < pBVar13 + uVar31);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar31;
    if (0xffff < uVar31) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12 = seqStore->sequences;
    psVar12->litLength = (U16)uVar31;
    psVar12->offBase = (uint)local_98 + 3;
    if (0xffff < lVar44 - 3U) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(lVar44 - 3U);
    seqStore->sequences = psVar12 + 1;
    uVar17 = (uint)local_98;
    uVar16 = local_12c;
  }
  puVar43 = (ulong *)((long)puVar43 + lVar44);
  if (puVar18 < puVar43) {
    uVar31 = (ulong)uVar16;
    local_12c = uVar17;
  }
  else {
    uVar35 = UVar34 + 2;
    pUVar10[(ulong)(*(long *)(pBVar9 + uVar35) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar35;
    pUVar10[(ulong)(*(long *)((long)puVar43 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar43 + -2) - iVar42;
    pUVar11[(uint)(*(int *)(pBVar9 + uVar35) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar35;
    pUVar11[(uint)(*(int *)((long)puVar43 + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)puVar43 + -1) - iVar42;
    do {
      uVar35 = uVar16;
      local_12c = uVar17;
      uVar31 = (ulong)uVar35;
      if ((uVar35 == 0) || ((int)*puVar43 != *(int *)((long)puVar43 - uVar31))) break;
      puVar32 = (ulong *)((long)puVar43 + 4);
      puVar24 = (ulong *)((long)puVar43 + (4 - uVar31));
      puVar28 = puVar32;
      if (puVar32 < puVar1) {
        uVar38 = *puVar32 ^ *puVar24;
        uVar26 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar26 = uVar26 >> 3 & 0x1fffffff;
        if (*puVar24 == *puVar32) {
          puVar28 = (ulong *)((long)puVar43 + 0xc);
          puVar24 = (ulong *)((long)puVar43 + (0xc - uVar31));
          do {
            if (puVar1 <= puVar28) goto LAB_01da899f;
            uVar31 = *puVar24;
            uVar38 = *puVar28;
            uVar39 = uVar38 ^ uVar31;
            uVar26 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (long)puVar28 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar32);
            puVar28 = puVar28 + 1;
            puVar24 = puVar24 + 1;
          } while (uVar31 == uVar38);
        }
      }
      else {
LAB_01da899f:
        if ((puVar28 < puVar2) && ((int)*puVar24 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar28 < puVar3) && ((short)*puVar24 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar28 < puVar6) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar24 == (char)*puVar28));
        }
        uVar26 = (long)puVar28 - (long)puVar32;
      }
      UVar34 = (int)puVar43 - iVar42;
      pUVar11[(uint)((int)*puVar43 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar34;
      pUVar10[*puVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar34;
      puVar32 = (ulong *)seqStore->lit;
      if (puVar4 < puVar43) {
        ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)puVar43,(BYTE *)puVar43,(BYTE *)puVar4);
      }
      else {
        uVar31 = puVar43[1];
        *puVar32 = *puVar43;
        puVar32[1] = uVar31;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < uVar26 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(uVar26 + 1);
      seqStore->sequences = psVar12 + 1;
      puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
      uVar31 = (ulong)local_12c;
      uVar17 = uVar35;
      uVar16 = local_12c;
      local_12c = uVar35;
    } while (puVar43 <= puVar18);
  }
  local_128 = (ulong *)((long)puVar43 + 1);
  uVar16 = (uint)uVar31;
  src = puVar43;
  if (puVar18 < local_128) goto LAB_01da8af0;
  goto LAB_01da7fa5;
LAB_01da6118:
  uVar17 = local_12c;
  if (iVar29 != 9) {
    iVar22 = (int)puVar28;
    if (iVar29 != 0xc) {
      if ((uVar25 < (uint)local_e8) && (*local_120 == *puVar28)) {
        puVar43 = puVar28 + 1;
        puVar32 = local_120 + 1;
        puVar24 = puVar43;
        if (puVar43 < puVar1) {
          uVar26 = *puVar43 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar43) {
            puVar24 = puVar28 + 2;
            puVar32 = local_120 + 2;
            do {
              if (puVar1 <= puVar24) goto LAB_01da6324;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar43);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da6324:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar43;
        }
        lVar44 = uVar31 + 8;
        local_d0 = (BYTE *)(ulong)(uint)(iVar22 - (int)local_120);
        puVar43 = puVar28;
        if ((puVar30 < local_120) && (src < puVar28)) {
          while( true ) {
            puVar24 = (ulong *)((long)puVar28 + -1);
            puVar32 = (ulong *)((long)local_120 + -1);
            puVar43 = puVar28;
            if (*(char *)puVar24 != *(char *)puVar32) break;
            lVar44 = lVar44 + 1;
            puVar43 = puVar24;
            local_120 = puVar32;
            if ((puVar24 <= src) || (puVar28 = puVar24, puVar32 <= puVar30)) break;
          }
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar43 + 4);
        puVar32 = (ulong *)(piVar36 + 1);
        puVar24 = puVar28;
        if (puVar28 < puVar1) {
          uVar26 = *puVar28 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar28) {
            puVar24 = (ulong *)((long)puVar43 + 0xc);
            puVar32 = (ulong *)(piVar36 + 3);
            do {
              if (puVar1 <= puVar24) goto LAB_01da625b;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da625b:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar28;
        }
        lVar44 = uVar31 + 4;
        local_c8._0_4_ = (int)piVar36;
        local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)local_c8);
        if ((uVar25 < uVar35) && (src < puVar43)) {
          puVar32 = (ulong *)(pBVar5 + uVar35);
          do {
            puVar28 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar28 != (char)*puVar32) ||
               (lVar44 = lVar44 + 1, puVar43 = puVar28, puVar28 <= src)) break;
            bVar14 = puVar30 < puVar32;
            puVar32 = (ulong *)((long)puVar32 + -1);
          } while (bVar14);
        }
      }
    }
    if (local_108 < 4) {
      pUVar10[(long)local_88] = iVar22 - iVar42;
    }
    uVar31 = (long)puVar43 - (long)src;
    puVar32 = (ulong *)seqStore->lit;
    if (puVar4 < puVar43) {
      ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
    }
    else {
      uVar26 = *(ulong *)((long)src + 8);
      *puVar32 = *src;
      puVar32[1] = uVar26;
      if (0x10 < uVar31) {
        pBVar13 = seqStore->lit;
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar13 + 0x18) = uVar26;
        if (0x20 < (long)uVar31) {
          lVar19 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar15 = puVar8[1];
            pBVar7 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar7 = *puVar8;
            *(undefined8 *)(pBVar7 + 8) = uVar15;
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar15 = puVar8[1];
            *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar7 + 0x18) = uVar15;
            lVar19 = lVar19 + 0x20;
          } while (pBVar7 + 0x20 < pBVar13 + uVar31);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar31;
    if (0xffff < uVar31) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12 = seqStore->sequences;
    psVar12->litLength = (U16)uVar31;
    psVar12->offBase = (uint)local_d0 + 3;
    if (0xffff < lVar44 - 3U) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(lVar44 - 3U);
    seqStore->sequences = psVar12 + 1;
    uVar17 = (uint)local_d0;
    uVar16 = local_12c;
  }
  puVar43 = (ulong *)((long)puVar43 + lVar44);
  if (puVar18 < puVar43) {
    uVar31 = (ulong)uVar16;
    local_12c = uVar17;
  }
  else {
    uVar35 = UVar34 + 2;
    lVar19 = *(long *)(pBVar9 + uVar35);
    pUVar10[(ulong)(lVar19 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar35;
    pUVar10[(ulong)(*(long *)((long)puVar43 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar43 + -2) - iVar42;
    pUVar11[(ulong)(lVar19 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar35;
    pUVar11[(ulong)(*(long *)((long)puVar43 + -1) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)puVar43 + -1) - iVar42;
    do {
      uVar35 = uVar16;
      local_12c = uVar17;
      uVar31 = (ulong)uVar35;
      if ((uVar35 == 0) || ((int)*puVar43 != *(int *)((long)puVar43 - uVar31))) break;
      puVar32 = (ulong *)((long)puVar43 + 4);
      puVar24 = (ulong *)((long)puVar43 + (4 - uVar31));
      puVar28 = puVar32;
      if (puVar32 < puVar1) {
        uVar38 = *puVar32 ^ *puVar24;
        uVar26 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar26 = uVar26 >> 3 & 0x1fffffff;
        if (*puVar24 == *puVar32) {
          puVar28 = (ulong *)((long)puVar43 + 0xc);
          puVar24 = (ulong *)((long)puVar43 + (0xc - uVar31));
          do {
            if (puVar1 <= puVar28) goto LAB_01da661e;
            uVar31 = *puVar24;
            uVar38 = *puVar28;
            uVar39 = uVar38 ^ uVar31;
            uVar26 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (long)puVar28 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar32);
            puVar28 = puVar28 + 1;
            puVar24 = puVar24 + 1;
          } while (uVar31 == uVar38);
        }
      }
      else {
LAB_01da661e:
        if ((puVar28 < puVar2) && ((int)*puVar24 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar28 < puVar3) && ((short)*puVar24 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar28 < puVar6) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar24 == (char)*puVar28));
        }
        uVar26 = (long)puVar28 - (long)puVar32;
      }
      UVar34 = (int)puVar43 - iVar42;
      uVar31 = *puVar43;
      pUVar11[uVar31 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar34;
      pUVar10[uVar31 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar34;
      puVar32 = (ulong *)seqStore->lit;
      if (puVar4 < puVar43) {
        ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)puVar43,(BYTE *)puVar43,(BYTE *)puVar4);
      }
      else {
        uVar31 = puVar43[1];
        *puVar32 = *puVar43;
        puVar32[1] = uVar31;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < uVar26 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(uVar26 + 1);
      seqStore->sequences = psVar12 + 1;
      puVar43 = (ulong *)((long)puVar43 + uVar26 + 4);
      uVar31 = (ulong)local_12c;
      uVar17 = uVar35;
      uVar16 = local_12c;
      local_12c = uVar35;
    } while (puVar43 <= puVar18);
  }
  local_128 = (ulong *)((long)puVar43 + 1);
  uVar16 = (uint)uVar31;
  src = puVar43;
  if (puVar18 < local_128) goto LAB_01da8af0;
  goto LAB_01da5c18;
LAB_01da78cf:
  if (iVar29 != 9) {
    iVar22 = (int)puVar28;
    if (iVar29 != 0xc) {
      if ((uVar25 < (uint)local_e8) && (*local_120 == *puVar28)) {
        puVar43 = puVar28 + 1;
        puVar32 = local_120 + 1;
        puVar24 = puVar43;
        if (puVar43 < puVar1) {
          uVar26 = *puVar43 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar43) {
            puVar24 = puVar28 + 2;
            puVar32 = local_120 + 2;
            do {
              if (puVar1 <= puVar24) goto LAB_01da7ae0;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar43);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da7ae0:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar43;
        }
        lVar44 = uVar31 + 8;
        local_d0 = (BYTE *)(ulong)(uint)(iVar22 - (int)local_120);
        puVar43 = puVar28;
        if ((puVar30 < local_120) && (src < puVar28)) {
          while( true ) {
            puVar24 = (ulong *)((long)puVar28 + -1);
            puVar32 = (ulong *)((long)local_120 + -1);
            puVar43 = puVar28;
            if (*(char *)puVar24 != *(char *)puVar32) break;
            lVar44 = lVar44 + 1;
            puVar43 = puVar24;
            local_120 = puVar32;
            if ((puVar24 <= src) || (puVar28 = puVar24, puVar32 <= puVar30)) break;
          }
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar43 + 4);
        puVar32 = (ulong *)(piVar36 + 1);
        puVar24 = puVar28;
        if (puVar28 < puVar1) {
          uVar26 = *puVar28 ^ *puVar32;
          uVar31 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar28) {
            puVar24 = (ulong *)((long)puVar43 + 0xc);
            puVar32 = (ulong *)(piVar36 + 3);
            do {
              if (puVar1 <= puVar24) goto LAB_01da7a22;
              uVar26 = *puVar32;
              uVar38 = *puVar24;
              uVar39 = uVar38 ^ uVar26;
              uVar31 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (long)puVar24 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28);
              puVar24 = puVar24 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar26 == uVar38);
          }
        }
        else {
LAB_01da7a22:
          if ((puVar24 < puVar2) && ((int)*puVar32 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar32 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar24 < puVar6) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar32 == (char)*puVar24));
          }
          uVar31 = (long)puVar24 - (long)puVar28;
        }
        lVar44 = uVar31 + 4;
        local_c8._0_4_ = (int)piVar36;
        local_d0 = (BYTE *)(ulong)(uint)((int)puVar43 - (int)local_c8);
        if ((uVar25 < uVar35) && (src < puVar43)) {
          puVar32 = (ulong *)(pBVar5 + uVar35);
          do {
            puVar28 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar28 != (char)*puVar32) ||
               (lVar44 = lVar44 + 1, puVar43 = puVar28, puVar28 <= src)) break;
            bVar14 = puVar30 < puVar32;
            puVar32 = (ulong *)((long)puVar32 + -1);
          } while (bVar14);
        }
      }
    }
    if (local_108 < 4) {
      pUVar10[(long)local_88] = iVar22 - iVar42;
    }
    uVar31 = (long)puVar43 - (long)src;
    puVar32 = (ulong *)seqStore->lit;
    if (puVar4 < puVar43) {
      ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
    }
    else {
      uVar26 = *(ulong *)((long)src + 8);
      *puVar32 = *src;
      puVar32[1] = uVar26;
      if (0x10 < uVar31) {
        pBVar13 = seqStore->lit;
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar13 + 0x18) = uVar26;
        if (0x20 < (long)uVar31) {
          lVar19 = 0;
          do {
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar15 = puVar8[1];
            pBVar7 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar7 = *puVar8;
            *(undefined8 *)(pBVar7 + 8) = uVar15;
            puVar8 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar15 = puVar8[1];
            *(undefined8 *)(pBVar7 + 0x10) = *puVar8;
            *(undefined8 *)(pBVar7 + 0x18) = uVar15;
            lVar19 = lVar19 + 0x20;
          } while (pBVar7 + 0x20 < pBVar13 + uVar31);
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar31;
    if (0xffff < uVar31) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12 = seqStore->sequences;
    psVar12->litLength = (U16)uVar31;
    psVar12->offBase = (uint)local_d0 + 3;
    if (0xffff < lVar44 - 3U) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(lVar44 - 3U);
    seqStore->sequences = psVar12 + 1;
    uVar16 = local_12c;
    local_12c = (uint)local_d0;
  }
  puVar43 = (ulong *)((long)puVar43 + lVar44);
  if (puVar18 < puVar43) {
    uVar31 = (ulong)uVar16;
    uVar26 = (ulong)local_12c;
  }
  else {
    uVar35 = UVar34 + 2;
    lVar19 = *(long *)(pBVar9 + uVar35);
    pUVar10[(ulong)(lVar19 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar35;
    pUVar10[(ulong)(*(long *)((long)puVar43 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar43 + -2) - iVar42;
    pUVar11[(ulong)(lVar19 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = uVar35;
    pUVar11[(ulong)(*(long *)((long)puVar43 + -1) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)puVar43 + -1) - iVar42;
    do {
      uVar35 = uVar16;
      uVar38 = (ulong)uVar35;
      uVar31 = uVar38;
      uVar26 = (ulong)local_12c;
      if ((uVar35 == 0) || ((int)*puVar43 != *(int *)((long)puVar43 - uVar38))) break;
      puVar32 = (ulong *)((long)puVar43 + 4);
      puVar24 = (ulong *)((long)puVar43 + (4 - uVar38));
      puVar28 = puVar32;
      if (puVar32 < puVar1) {
        uVar26 = *puVar32 ^ *puVar24;
        uVar31 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar31 = uVar31 >> 3 & 0x1fffffff;
        if (*puVar24 == *puVar32) {
          puVar28 = (ulong *)((long)puVar43 + 0xc);
          puVar24 = (ulong *)((long)puVar43 + (0xc - uVar38));
          do {
            if (puVar1 <= puVar28) goto LAB_01da7de9;
            uVar26 = *puVar24;
            uVar39 = *puVar28;
            uVar40 = uVar39 ^ uVar26;
            uVar31 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = (long)puVar28 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar32);
            puVar28 = puVar28 + 1;
            puVar24 = puVar24 + 1;
          } while (uVar26 == uVar39);
        }
      }
      else {
LAB_01da7de9:
        if ((puVar28 < puVar2) && ((int)*puVar24 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar28 < puVar3) && ((short)*puVar24 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar28 < puVar6) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar24 == (char)*puVar28));
        }
        uVar31 = (long)puVar28 - (long)puVar32;
      }
      UVar34 = (int)puVar43 - iVar42;
      uVar26 = *puVar43;
      pUVar11[uVar26 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar34;
      pUVar10[uVar26 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar34;
      puVar32 = (ulong *)seqStore->lit;
      if (puVar4 < puVar43) {
        ZSTD_safecopyLiterals((BYTE *)puVar32,(BYTE *)puVar43,(BYTE *)puVar43,(BYTE *)puVar4);
      }
      else {
        uVar26 = puVar43[1];
        *puVar32 = *puVar43;
        puVar32[1] = uVar26;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < uVar31 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(uVar31 + 1);
      seqStore->sequences = psVar12 + 1;
      puVar43 = (ulong *)((long)puVar43 + uVar31 + 4);
      uVar31 = (ulong)local_12c;
      uVar26 = uVar38;
      uVar16 = local_12c;
      local_12c = uVar35;
    } while (puVar43 <= puVar18);
  }
  local_128 = (ulong *)((long)puVar43 + 1);
  local_12c = (uint)uVar26;
  uVar16 = (uint)uVar31;
  src = puVar43;
  if (puVar18 < local_128) goto LAB_01da8af0;
  goto LAB_01da73e8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}